

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_avx2.c
# Opt level: O0

void av1_wiener_convolve_add_src_avx2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i data_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  int iVar59;
  long lVar60;
  long in_RCX;
  long lVar61;
  uint uVar62;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  void *in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m128i *p_0_1;
  __m128i res_8b_1;
  __m128i res_16bit_1;
  __m128i reshi;
  __m128i reslo;
  __m256i res_round;
  __m256i convolveres;
  __m128i s7_1;
  __m128i s3;
  __m128i s7_;
  __m128i s6_;
  int16_t *data_2;
  __m128i *p_1;
  __m128i *p_0;
  __m128i res_1;
  __m128i res_0;
  __m256i res_8b;
  __m256i res_16bit;
  __m256i res_b_round;
  __m256i res_a_round;
  __m256i res_b;
  __m256i res_a;
  __m256i s7;
  __m256i s6;
  int16_t *data_1;
  __m256i s [8];
  __m256i src_5;
  __m256i src_4;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  __m256i res_clamped;
  __m256i data_0;
  __m256i res;
  __m256i data;
  __m128i round_shift_v;
  __m256i round_const_v;
  __m256i filter_coeffs_y;
  __m128i coeffs_y;
  __m128i offset_0;
  __m128i zero_128;
  __m128i round_shift_h;
  __m256i clamp_high;
  __m256i clamp_low;
  __m256i round_const_horz;
  __m256i round_const_h;
  __m256i filter_coeffs_x;
  __m128i coeffs_x;
  __m256i filt_center;
  __m256i coeffs_v [4];
  __m256i coeffs_h [4];
  __m256i filt [4];
  uint8_t *src_ptr;
  int center_tap;
  int j;
  int i;
  int im_stride;
  int im_h;
  int16_t im_block [1088];
  int bd;
  undefined8 local_1c60;
  undefined8 uStackY_1c58;
  undefined8 local_1c50;
  undefined8 uStackY_1c48;
  undefined8 local_1c40;
  undefined8 uStackY_1c38;
  undefined8 local_1c20;
  __m256i *in_stack_ffffffffffffe3e8;
  __m256i *in_stack_ffffffffffffe3f0;
  undefined8 in_stack_ffffffffffffe3f8;
  undefined8 in_stack_ffffffffffffe400;
  __m256i *in_stack_ffffffffffffe408;
  __m256i *in_stack_ffffffffffffe410;
  __m256i *s_00;
  undefined8 local_1bd0;
  __m256i *palStack_1bc8;
  undefined8 local_1b80;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 local_1840 [16];
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined1 local_1820 [32];
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  int local_14f0;
  int local_14ec;
  undefined8 local_14e0 [4];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 uStack_1480;
  undefined8 uStack_1478;
  undefined8 auStack_1470 [258];
  undefined4 local_c60;
  undefined8 *local_c58;
  long local_c50;
  long local_c48;
  long local_c40;
  long local_c38;
  uint8_t *local_c30;
  uint8_t *local_c28;
  uint8_t *local_c20;
  uint8_t *local_c18;
  uint8_t *local_c10;
  undefined1 (*local_c08) [16];
  undefined1 (*local_c00) [16];
  undefined1 (*local_bf8) [16];
  undefined1 (*local_bf0) [16];
  undefined8 *local_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  uint8_t local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  uint8_t local_b60 [8];
  uint8_t auStack_b58 [8];
  uint8_t auStack_b50 [8];
  uint8_t auStack_b48 [8];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  uint8_t local_b20 [8];
  uint8_t auStack_b18 [8];
  uint8_t auStack_b10 [8];
  uint8_t auStack_b08 [8];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  uint8_t local_ae0 [8];
  uint8_t auStack_ad8 [8];
  uint8_t auStack_ad0 [8];
  uint8_t auStack_ac8 [8];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  uint8_t local_aa0 [8];
  uint8_t auStack_a98 [8];
  uint8_t auStack_a90 [8];
  uint8_t auStack_a88 [26];
  ushort local_a6e;
  ushort local_a6c;
  ushort local_a6a;
  undefined2 local_a68;
  undefined2 local_a66;
  undefined2 local_a64;
  undefined2 local_a62;
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  uint local_a14;
  undefined1 local_a10 [16];
  uint local_9f4;
  undefined1 local_9f0 [16];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined1 local_9d0 [16];
  uint local_9b4;
  undefined8 local_9b0;
  __m256i *palStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  ulong local_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  uint local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  undefined8 local_820;
  ulong uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 *local_7a8;
  undefined1 (*local_7a0) [32];
  undefined1 (*local_798) [32];
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  ulong local_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  ulong local_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  ulong local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  __m256i *palStack_478;
  __m256i *palStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  __m256i *palStack_358;
  __m256i *palStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 *local_308;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  __m256i *local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined2 local_220;
  undefined2 local_21e;
  undefined2 local_21c;
  undefined2 local_21a;
  undefined2 local_218;
  undefined2 local_216;
  undefined2 local_214;
  undefined2 local_212;
  undefined2 local_210;
  undefined2 local_20e;
  undefined2 local_20c;
  undefined2 local_20a;
  undefined2 local_208;
  undefined2 local_206;
  undefined2 local_204;
  undefined2 local_202;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined2 local_1e0;
  undefined2 local_1de;
  undefined2 local_1dc;
  undefined2 local_1da;
  undefined2 local_1d8;
  undefined2 local_1d6;
  undefined2 local_1d4;
  undefined2 local_1d2;
  undefined2 local_1d0;
  undefined2 local_1ce;
  undefined2 local_1cc;
  undefined2 local_1ca;
  undefined2 local_1c8;
  undefined2 local_1c6;
  undefined2 local_1c4;
  undefined2 local_1c2;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined2 local_1a0;
  undefined2 local_19e;
  undefined2 local_19c;
  undefined2 local_19a;
  undefined2 local_198;
  undefined2 local_196;
  undefined2 local_194;
  undefined2 local_192;
  undefined2 local_190;
  undefined2 local_18e;
  undefined2 local_18c;
  undefined2 local_18a;
  undefined2 local_188;
  undefined2 local_186;
  undefined2 local_184;
  undefined2 local_182;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined2 local_160;
  undefined2 local_15e;
  undefined2 local_15c;
  undefined2 local_15a;
  undefined2 local_158;
  undefined2 local_156;
  undefined2 local_154;
  undefined2 local_152;
  undefined2 local_150;
  undefined2 local_14e;
  undefined2 local_14c;
  undefined2 local_14a;
  undefined2 local_148;
  undefined2 local_146;
  undefined2 local_144;
  undefined2 local_142;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_c60 = 8;
  iVar59 = w + 6;
  lVar60 = (long)(iVar59 * 8);
  auVar64 = ZEXT816(0) << 0x40;
  local_c58 = in_R8;
  local_c50 = in_RCX;
  local_c48 = in_RDX;
  local_c40 = in_RSI;
  local_c38 = in_RDI;
  *(undefined1 (*) [32])((long)&uStack_1480 + lVar60 * 2) = ZEXT1632(auVar64);
  *(undefined1 (*) [32])((long)&local_14a0 + lVar60 * 2) = ZEXT1632(auVar64);
  *(undefined1 (*) [32])((long)&local_14c0 + lVar60 * 2) = ZEXT1632(auVar64);
  *(undefined1 (*) [32])((long)local_14e0 + lVar60 * 2) = ZEXT1632(auVar64);
  lVar60 = local_c38 + -3 + local_c40 * -3;
  local_c10 = "";
  local_c18 = 
  "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n"
  ;
  local_c20 = "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f"
  ;
  local_c28 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
  local_c30 = filt_center_global_avx2;
  local_be8 = local_c58;
  local_bd0 = *local_c58;
  uStack_bc8 = local_c58[1];
  local_a62 = 0x200;
  local_202 = 0x200;
  local_204 = 0x200;
  local_206 = 0x200;
  local_208 = 0x200;
  local_20a = 0x200;
  local_20c = 0x200;
  local_20e = 0x200;
  local_210 = 0x200;
  local_212 = 0x200;
  local_214 = 0x200;
  local_216 = 0x200;
  local_218 = 0x200;
  local_21a = 0x200;
  local_21c = 0x200;
  local_21e = 0x200;
  local_220 = 0x200;
  auVar64 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar64 = vpinsrw_avx(auVar64,0x200,2);
  auVar64 = vpinsrw_avx(auVar64,0x200,3);
  auVar64 = vpinsrw_avx(auVar64,0x200,4);
  auVar64 = vpinsrw_avx(auVar64,0x200,5);
  auVar64 = vpinsrw_avx(auVar64,0x200,6);
  local_240 = vpinsrw_avx(auVar64,0x200,7);
  auVar64 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar64 = vpinsrw_avx(auVar64,0x200,2);
  auVar64 = vpinsrw_avx(auVar64,0x200,3);
  auVar64 = vpinsrw_avx(auVar64,0x200,4);
  auVar64 = vpinsrw_avx(auVar64,0x200,5);
  auVar64 = vpinsrw_avx(auVar64,0x200,6);
  auStack_230 = vpinsrw_avx(auVar64,0x200,7);
  local_aa0[0] = local_bc0[0];
  local_aa0[1] = local_bc0[1];
  local_aa0[2] = local_bc0[2];
  local_aa0[3] = local_bc0[3];
  local_aa0[4] = local_bc0[4];
  local_aa0[5] = local_bc0[5];
  local_aa0[6] = local_bc0[6];
  local_aa0[7] = local_bc0[7];
  auStack_a98[0] = local_bc0[8];
  auStack_a98[1] = local_bc0[9];
  auStack_a98[2] = local_bc0[10];
  auStack_a98[3] = local_bc0[0xb];
  auStack_a98[4] = local_bc0[0xc];
  auStack_a98[5] = local_bc0[0xd];
  auStack_a98[6] = local_bc0[0xe];
  auStack_a98[7] = local_bc0[0xf];
  auStack_a90[0] = local_bc0[0];
  auStack_a90[1] = local_bc0[1];
  auStack_a90[2] = local_bc0[2];
  auStack_a90[3] = local_bc0[3];
  auStack_a90[4] = local_bc0[4];
  auStack_a90[5] = local_bc0[5];
  auStack_a90[6] = local_bc0[6];
  auStack_a90[7] = local_bc0[7];
  auStack_a88[0] = local_bc0[8];
  auStack_a88[1] = local_bc0[9];
  auStack_a88[2] = local_bc0[10];
  auStack_a88[3] = local_bc0[0xb];
  auStack_a88[4] = local_bc0[0xc];
  auStack_a88[5] = local_bc0[0xd];
  auStack_a88[6] = local_bc0[0xe];
  auStack_a88[7] = local_bc0[0xf];
  local_ac0 = local_240._0_8_;
  uStack_ab8 = local_240._8_8_;
  uStack_ab0 = auStack_230._0_8_;
  uStack_aa8 = auStack_230._8_8_;
  auVar16[8] = local_bc0[8];
  auVar16[9] = local_bc0[9];
  auVar16[10] = local_bc0[10];
  auVar16[0xb] = local_bc0[0xb];
  auVar16[0xc] = local_bc0[0xc];
  auVar16[0xd] = local_bc0[0xd];
  auVar16[0xe] = local_bc0[0xe];
  auVar16[0xf] = local_bc0[0xf];
  auVar16[0] = local_bc0[0];
  auVar16[1] = local_bc0[1];
  auVar16[2] = local_bc0[2];
  auVar16[3] = local_bc0[3];
  auVar16[4] = local_bc0[4];
  auVar16[5] = local_bc0[5];
  auVar16[6] = local_bc0[6];
  auVar16[7] = local_bc0[7];
  auVar16[0x10] = local_bc0[0];
  auVar16[0x11] = local_bc0[1];
  auVar16[0x12] = local_bc0[2];
  auVar16[0x13] = local_bc0[3];
  auVar16[0x14] = local_bc0[4];
  auVar16[0x15] = local_bc0[5];
  auVar16[0x16] = local_bc0[6];
  auVar16[0x17] = local_bc0[7];
  auVar16[0x18] = local_bc0[8];
  auVar16[0x19] = local_bc0[9];
  auVar16[0x1a] = local_bc0[10];
  auVar16[0x1b] = local_bc0[0xb];
  auVar16[0x1c] = local_bc0[0xc];
  auVar16[0x1d] = local_bc0[0xd];
  auVar16[0x1e] = local_bc0[0xe];
  auVar16[0x1f] = local_bc0[0xf];
  auVar15._16_8_ = auStack_230._0_8_;
  auVar15._0_16_ = local_240;
  auVar15._24_8_ = auStack_230._8_8_;
  vpshufb_avx2(auVar16,auVar15);
  local_a64 = 0x604;
  local_1c2 = 0x604;
  local_1c4 = 0x604;
  local_1c6 = 0x604;
  local_1c8 = 0x604;
  local_1ca = 0x604;
  local_1cc = 0x604;
  local_1ce = 0x604;
  local_1d0 = 0x604;
  local_1d2 = 0x604;
  local_1d4 = 0x604;
  local_1d6 = 0x604;
  local_1d8 = 0x604;
  local_1da = 0x604;
  local_1dc = 0x604;
  local_1de = 0x604;
  local_1e0 = 0x604;
  auVar64 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar64 = vpinsrw_avx(auVar64,0x604,2);
  auVar64 = vpinsrw_avx(auVar64,0x604,3);
  auVar64 = vpinsrw_avx(auVar64,0x604,4);
  auVar64 = vpinsrw_avx(auVar64,0x604,5);
  auVar64 = vpinsrw_avx(auVar64,0x604,6);
  local_200 = vpinsrw_avx(auVar64,0x604,7);
  auVar64 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar64 = vpinsrw_avx(auVar64,0x604,2);
  auVar64 = vpinsrw_avx(auVar64,0x604,3);
  auVar64 = vpinsrw_avx(auVar64,0x604,4);
  auVar64 = vpinsrw_avx(auVar64,0x604,5);
  auVar64 = vpinsrw_avx(auVar64,0x604,6);
  auStack_1f0 = vpinsrw_avx(auVar64,0x604,7);
  local_ae0[0] = local_bc0[0];
  local_ae0[1] = local_bc0[1];
  local_ae0[2] = local_bc0[2];
  local_ae0[3] = local_bc0[3];
  local_ae0[4] = local_bc0[4];
  local_ae0[5] = local_bc0[5];
  local_ae0[6] = local_bc0[6];
  local_ae0[7] = local_bc0[7];
  auStack_ad8[0] = local_bc0[8];
  auStack_ad8[1] = local_bc0[9];
  auStack_ad8[2] = local_bc0[10];
  auStack_ad8[3] = local_bc0[0xb];
  auStack_ad8[4] = local_bc0[0xc];
  auStack_ad8[5] = local_bc0[0xd];
  auStack_ad8[6] = local_bc0[0xe];
  auStack_ad8[7] = local_bc0[0xf];
  auStack_ad0[0] = local_bc0[0];
  auStack_ad0[1] = local_bc0[1];
  auStack_ad0[2] = local_bc0[2];
  auStack_ad0[3] = local_bc0[3];
  auStack_ad0[4] = local_bc0[4];
  auStack_ad0[5] = local_bc0[5];
  auStack_ad0[6] = local_bc0[6];
  auStack_ad0[7] = local_bc0[7];
  auStack_ac8[0] = local_bc0[8];
  auStack_ac8[1] = local_bc0[9];
  auStack_ac8[2] = local_bc0[10];
  auStack_ac8[3] = local_bc0[0xb];
  auStack_ac8[4] = local_bc0[0xc];
  auStack_ac8[5] = local_bc0[0xd];
  auStack_ac8[6] = local_bc0[0xe];
  auStack_ac8[7] = local_bc0[0xf];
  local_b00 = local_200._0_8_;
  uStack_af8 = local_200._8_8_;
  uStack_af0 = auStack_1f0._0_8_;
  uStack_ae8 = auStack_1f0._8_8_;
  auVar14[8] = local_bc0[8];
  auVar14[9] = local_bc0[9];
  auVar14[10] = local_bc0[10];
  auVar14[0xb] = local_bc0[0xb];
  auVar14[0xc] = local_bc0[0xc];
  auVar14[0xd] = local_bc0[0xd];
  auVar14[0xe] = local_bc0[0xe];
  auVar14[0xf] = local_bc0[0xf];
  auVar14[0] = local_bc0[0];
  auVar14[1] = local_bc0[1];
  auVar14[2] = local_bc0[2];
  auVar14[3] = local_bc0[3];
  auVar14[4] = local_bc0[4];
  auVar14[5] = local_bc0[5];
  auVar14[6] = local_bc0[6];
  auVar14[7] = local_bc0[7];
  auVar14[0x10] = local_bc0[0];
  auVar14[0x11] = local_bc0[1];
  auVar14[0x12] = local_bc0[2];
  auVar14[0x13] = local_bc0[3];
  auVar14[0x14] = local_bc0[4];
  auVar14[0x15] = local_bc0[5];
  auVar14[0x16] = local_bc0[6];
  auVar14[0x17] = local_bc0[7];
  auVar14[0x18] = local_bc0[8];
  auVar14[0x19] = local_bc0[9];
  auVar14[0x1a] = local_bc0[10];
  auVar14[0x1b] = local_bc0[0xb];
  auVar14[0x1c] = local_bc0[0xc];
  auVar14[0x1d] = local_bc0[0xd];
  auVar14[0x1e] = local_bc0[0xe];
  auVar14[0x1f] = local_bc0[0xf];
  auVar13._16_8_ = auStack_1f0._0_8_;
  auVar13._0_16_ = local_200;
  auVar13._24_8_ = auStack_1f0._8_8_;
  vpshufb_avx2(auVar14,auVar13);
  local_a66 = 0xa08;
  local_182 = 0xa08;
  local_184 = 0xa08;
  local_186 = 0xa08;
  local_188 = 0xa08;
  local_18a = 0xa08;
  local_18c = 0xa08;
  local_18e = 0xa08;
  local_190 = 0xa08;
  local_192 = 0xa08;
  local_194 = 0xa08;
  local_196 = 0xa08;
  local_198 = 0xa08;
  local_19a = 0xa08;
  local_19c = 0xa08;
  local_19e = 0xa08;
  local_1a0 = 0xa08;
  auVar64 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar64 = vpinsrw_avx(auVar64,0xa08,2);
  auVar64 = vpinsrw_avx(auVar64,0xa08,3);
  auVar64 = vpinsrw_avx(auVar64,0xa08,4);
  auVar64 = vpinsrw_avx(auVar64,0xa08,5);
  auVar64 = vpinsrw_avx(auVar64,0xa08,6);
  local_1c0 = vpinsrw_avx(auVar64,0xa08,7);
  auVar64 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar64 = vpinsrw_avx(auVar64,0xa08,2);
  auVar64 = vpinsrw_avx(auVar64,0xa08,3);
  auVar64 = vpinsrw_avx(auVar64,0xa08,4);
  auVar64 = vpinsrw_avx(auVar64,0xa08,5);
  auVar64 = vpinsrw_avx(auVar64,0xa08,6);
  auStack_1b0 = vpinsrw_avx(auVar64,0xa08,7);
  local_b20[0] = local_bc0[0];
  local_b20[1] = local_bc0[1];
  local_b20[2] = local_bc0[2];
  local_b20[3] = local_bc0[3];
  local_b20[4] = local_bc0[4];
  local_b20[5] = local_bc0[5];
  local_b20[6] = local_bc0[6];
  local_b20[7] = local_bc0[7];
  auStack_b18[0] = local_bc0[8];
  auStack_b18[1] = local_bc0[9];
  auStack_b18[2] = local_bc0[10];
  auStack_b18[3] = local_bc0[0xb];
  auStack_b18[4] = local_bc0[0xc];
  auStack_b18[5] = local_bc0[0xd];
  auStack_b18[6] = local_bc0[0xe];
  auStack_b18[7] = local_bc0[0xf];
  auStack_b10[0] = local_bc0[0];
  auStack_b10[1] = local_bc0[1];
  auStack_b10[2] = local_bc0[2];
  auStack_b10[3] = local_bc0[3];
  auStack_b10[4] = local_bc0[4];
  auStack_b10[5] = local_bc0[5];
  auStack_b10[6] = local_bc0[6];
  auStack_b10[7] = local_bc0[7];
  auStack_b08[0] = local_bc0[8];
  auStack_b08[1] = local_bc0[9];
  auStack_b08[2] = local_bc0[10];
  auStack_b08[3] = local_bc0[0xb];
  auStack_b08[4] = local_bc0[0xc];
  auStack_b08[5] = local_bc0[0xd];
  auStack_b08[6] = local_bc0[0xe];
  auStack_b08[7] = local_bc0[0xf];
  local_b40 = local_1c0._0_8_;
  uStack_b38 = local_1c0._8_8_;
  uStack_b30 = auStack_1b0._0_8_;
  uStack_b28 = auStack_1b0._8_8_;
  auVar12[8] = local_bc0[8];
  auVar12[9] = local_bc0[9];
  auVar12[10] = local_bc0[10];
  auVar12[0xb] = local_bc0[0xb];
  auVar12[0xc] = local_bc0[0xc];
  auVar12[0xd] = local_bc0[0xd];
  auVar12[0xe] = local_bc0[0xe];
  auVar12[0xf] = local_bc0[0xf];
  auVar12[0] = local_bc0[0];
  auVar12[1] = local_bc0[1];
  auVar12[2] = local_bc0[2];
  auVar12[3] = local_bc0[3];
  auVar12[4] = local_bc0[4];
  auVar12[5] = local_bc0[5];
  auVar12[6] = local_bc0[6];
  auVar12[7] = local_bc0[7];
  auVar12[0x10] = local_bc0[0];
  auVar12[0x11] = local_bc0[1];
  auVar12[0x12] = local_bc0[2];
  auVar12[0x13] = local_bc0[3];
  auVar12[0x14] = local_bc0[4];
  auVar12[0x15] = local_bc0[5];
  auVar12[0x16] = local_bc0[6];
  auVar12[0x17] = local_bc0[7];
  auVar12[0x18] = local_bc0[8];
  auVar12[0x19] = local_bc0[9];
  auVar12[0x1a] = local_bc0[10];
  auVar12[0x1b] = local_bc0[0xb];
  auVar12[0x1c] = local_bc0[0xc];
  auVar12[0x1d] = local_bc0[0xd];
  auVar12[0x1e] = local_bc0[0xe];
  auVar12[0x1f] = local_bc0[0xf];
  auVar11._16_8_ = auStack_1b0._0_8_;
  auVar11._0_16_ = local_1c0;
  auVar11._24_8_ = auStack_1b0._8_8_;
  vpshufb_avx2(auVar12,auVar11);
  local_a68 = 0xe0c;
  local_142 = 0xe0c;
  local_144 = 0xe0c;
  local_146 = 0xe0c;
  local_148 = 0xe0c;
  local_14a = 0xe0c;
  local_14c = 0xe0c;
  local_14e = 0xe0c;
  local_150 = 0xe0c;
  local_152 = 0xe0c;
  local_154 = 0xe0c;
  local_156 = 0xe0c;
  local_158 = 0xe0c;
  local_15a = 0xe0c;
  local_15c = 0xe0c;
  local_15e = 0xe0c;
  local_160 = 0xe0c;
  auVar64 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,2);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,3);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,4);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,5);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,6);
  local_180 = vpinsrw_avx(auVar64,0xe0c,7);
  auVar64 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,2);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,3);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,4);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,5);
  auVar64 = vpinsrw_avx(auVar64,0xe0c,6);
  auStack_170 = vpinsrw_avx(auVar64,0xe0c,7);
  local_b60[0] = local_bc0[0];
  local_b60[1] = local_bc0[1];
  local_b60[2] = local_bc0[2];
  local_b60[3] = local_bc0[3];
  local_b60[4] = local_bc0[4];
  local_b60[5] = local_bc0[5];
  local_b60[6] = local_bc0[6];
  local_b60[7] = local_bc0[7];
  auStack_b58[0] = local_bc0[8];
  auStack_b58[1] = local_bc0[9];
  auStack_b58[2] = local_bc0[10];
  auStack_b58[3] = local_bc0[0xb];
  auStack_b58[4] = local_bc0[0xc];
  auStack_b58[5] = local_bc0[0xd];
  auStack_b58[6] = local_bc0[0xe];
  auStack_b58[7] = local_bc0[0xf];
  auStack_b50[0] = local_bc0[0];
  auStack_b50[1] = local_bc0[1];
  auStack_b50[2] = local_bc0[2];
  auStack_b50[3] = local_bc0[3];
  auStack_b50[4] = local_bc0[4];
  auStack_b50[5] = local_bc0[5];
  auStack_b50[6] = local_bc0[6];
  auStack_b50[7] = local_bc0[7];
  auStack_b48[0] = local_bc0[8];
  auStack_b48[1] = local_bc0[9];
  auStack_b48[2] = local_bc0[10];
  auStack_b48[3] = local_bc0[0xb];
  auStack_b48[4] = local_bc0[0xc];
  auStack_b48[5] = local_bc0[0xd];
  auStack_b48[6] = local_bc0[0xe];
  auStack_b48[7] = local_bc0[0xf];
  local_b80 = local_180._0_8_;
  uStack_b78 = local_180._8_8_;
  uStack_b70 = auStack_170._0_8_;
  uStack_b68 = auStack_170._8_8_;
  auVar10[8] = local_bc0[8];
  auVar10[9] = local_bc0[9];
  auVar10[10] = local_bc0[10];
  auVar10[0xb] = local_bc0[0xb];
  auVar10[0xc] = local_bc0[0xc];
  auVar10[0xd] = local_bc0[0xd];
  auVar10[0xe] = local_bc0[0xe];
  auVar10[0xf] = local_bc0[0xf];
  auVar10[0] = local_bc0[0];
  auVar10[1] = local_bc0[1];
  auVar10[2] = local_bc0[2];
  auVar10[3] = local_bc0[3];
  auVar10[4] = local_bc0[4];
  auVar10[5] = local_bc0[5];
  auVar10[6] = local_bc0[6];
  auVar10[7] = local_bc0[7];
  auVar10[0x10] = local_bc0[0];
  auVar10[0x11] = local_bc0[1];
  auVar10[0x12] = local_bc0[2];
  auVar10[0x13] = local_bc0[3];
  auVar10[0x14] = local_bc0[4];
  auVar10[0x15] = local_bc0[5];
  auVar10[0x16] = local_bc0[6];
  auVar10[0x17] = local_bc0[7];
  auVar10[0x18] = local_bc0[8];
  auVar10[0x19] = local_bc0[9];
  auVar10[0x1a] = local_bc0[10];
  auVar10[0x1b] = local_bc0[0xb];
  auVar10[0x1c] = local_bc0[0xc];
  auVar10[0x1d] = local_bc0[0xd];
  auVar10[0x1e] = local_bc0[0xe];
  auVar10[0x1f] = local_bc0[0xf];
  auVar9._16_8_ = auStack_170._0_8_;
  auVar9._0_16_ = local_180;
  auVar9._24_8_ = auStack_170._8_8_;
  vpshufb_avx2(auVar10,auVar9);
  uVar62 = 1 << (*(char *)CONCAT44(in_stack_0000002c,h) - 1U & 0x1f);
  local_a6a = (ushort)uVar62;
  auVar64 = vpinsrw_avx(ZEXT216(local_a6a),uVar62 & 0xffff,1);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,2);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,3);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,4);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,5);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar64,uVar62 & 0xffff,7);
  auVar64 = vpinsrw_avx(ZEXT216(local_a6a),uVar62 & 0xffff,1);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,2);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,3);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,4);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,5);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,6);
  auStack_130 = vpinsrw_avx(auVar64,uVar62 & 0xffff,7);
  local_140._0_8_ = auVar3._0_8_;
  uVar43 = local_140._0_8_;
  local_140._8_8_ = auVar3._8_8_;
  uVar44 = local_140._8_8_;
  uVar45 = auStack_130._0_8_;
  uVar46 = auStack_130._8_8_;
  uVar62 = 1 << (0xeU - *(char *)CONCAT44(in_stack_0000002c,h) & 0x1f);
  local_a6c = (ushort)uVar62;
  auVar64 = vpinsrw_avx(ZEXT216(local_a6c),uVar62 & 0xffff,1);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,2);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,3);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,4);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,5);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar64,uVar62 & 0xffff,7);
  auVar64 = vpinsrw_avx(ZEXT216(local_a6c),uVar62 & 0xffff,1);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,2);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,3);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,4);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,5);
  auVar64 = vpinsrw_avx(auVar64,uVar62 & 0xffff,6);
  auStack_f0 = vpinsrw_avx(auVar64,uVar62 & 0xffff,7);
  local_100._0_8_ = auVar4._0_8_;
  uVar47 = local_100._0_8_;
  local_100._8_8_ = auVar4._8_8_;
  uVar48 = local_100._8_8_;
  uVar49 = auStack_f0._0_8_;
  uVar50 = auStack_f0._8_8_;
  local_a60._8_8_ = SUB328(ZEXT832(0),4);
  uVar40 = local_a60._8_8_;
  local_a6e = (short)(1 << (0x10U - *(char *)CONCAT44(in_stack_0000002c,h) & 0x1f)) - 1;
  auVar64 = vpinsrw_avx(ZEXT216(local_a6e),(uint)local_a6e,1);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,2);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,3);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,4);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,5);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,6);
  auVar5 = vpinsrw_avx(auVar64,(uint)local_a6e,7);
  auVar64 = vpinsrw_avx(ZEXT216(local_a6e),(uint)local_a6e,1);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,2);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,3);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,4);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,5);
  auVar64 = vpinsrw_avx(auVar64,(uint)local_a6e,6);
  auStack_b0 = vpinsrw_avx(auVar64,(uint)local_a6e,7);
  local_c0._0_8_ = auVar5._0_8_;
  uVar51 = local_c0._0_8_;
  local_c0._8_8_ = auVar5._8_8_;
  uVar52 = local_c0._8_8_;
  uVar53 = auStack_b0._0_8_;
  uVar54 = auStack_b0._8_8_;
  local_9f4 = *(uint *)CONCAT44(in_stack_0000002c,h);
  local_a10._4_4_ = 0;
  local_a10._0_4_ = local_9f4;
  uVar42 = local_a10._0_8_;
  local_9f0._8_8_ = SUB168(ZEXT816(0),4);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_9f0._8_8_;
  auVar64 = vpinsrw_avx(auVar64 << 0x40,0x80,3);
  auVar65 = auVar64;
  local_a60 = ZEXT832(0) << 0x20;
  local_a10 = ZEXT416(local_9f4);
  local_9f0 = ZEXT816(0) << 0x20;
  local_140 = auVar3;
  local_120 = local_a6a;
  local_11e = local_a6a;
  local_11c = local_a6a;
  local_11a = local_a6a;
  local_118 = local_a6a;
  local_116 = local_a6a;
  local_114 = local_a6a;
  local_112 = local_a6a;
  local_110 = local_a6a;
  local_10e = local_a6a;
  local_10c = local_a6a;
  local_10a = local_a6a;
  local_108 = local_a6a;
  local_106 = local_a6a;
  local_104 = local_a6a;
  local_102 = local_a6a;
  local_100 = auVar4;
  local_e0 = local_a6c;
  local_de = local_a6c;
  local_dc = local_a6c;
  local_da = local_a6c;
  local_d8 = local_a6c;
  local_d6 = local_a6c;
  local_d4 = local_a6c;
  local_d2 = local_a6c;
  local_d0 = local_a6c;
  local_ce = local_a6c;
  local_cc = local_a6c;
  local_ca = local_a6c;
  local_c8 = local_a6c;
  local_c6 = local_a6c;
  local_c4 = local_a6c;
  local_c2 = local_a6c;
  local_c0 = auVar5;
  local_a0 = local_a6e;
  local_9e = local_a6e;
  local_9c = local_a6e;
  local_9a = local_a6e;
  local_98 = local_a6e;
  local_96 = local_a6e;
  local_94 = local_a6e;
  local_92 = local_a6e;
  local_90 = local_a6e;
  local_8e = local_a6e;
  local_8c = local_a6e;
  local_8a = local_a6e;
  local_88 = local_a6e;
  local_86 = local_a6e;
  local_84 = local_a6e;
  local_82 = local_a6e;
  xx_loadu_128(in_stack_00000008);
  local_1790 = auVar64._0_8_;
  uStack_1788 = auVar64._8_8_;
  local_9e0 = local_1790;
  uStack_9d8 = uStack_1788;
  auVar64 = vpaddw_avx(auVar65,auVar64);
  local_17a0 = auVar64._0_8_;
  uStack_1798 = auVar64._8_8_;
  local_be0 = local_17a0;
  uStack_bd8 = uStack_1798;
  auVar66._8_8_ = uStack_bc8;
  auVar66._0_8_ = local_bd0;
  auVar66._16_8_ = local_bd0;
  auVar66._24_8_ = uStack_bc8;
  vpshufd_avx2(auVar66,0);
  auVar67._8_8_ = uStack_bc8;
  auVar67._0_8_ = local_bd0;
  auVar67._16_8_ = local_bd0;
  auVar67._24_8_ = uStack_bc8;
  vpshufd_avx2(auVar67,0x55);
  auVar6._8_8_ = uStack_bc8;
  auVar6._0_8_ = local_bd0;
  auVar6._16_8_ = local_bd0;
  auVar6._24_8_ = uStack_bc8;
  vpshufd_avx2(auVar6,0xaa);
  auVar7._8_8_ = uStack_bc8;
  auVar7._0_8_ = local_bd0;
  auVar7._16_8_ = local_bd0;
  auVar7._24_8_ = uStack_bc8;
  vpshufd_avx2(auVar7,0xff);
  cVar1 = *(char *)(CONCAT44(in_stack_0000002c,h) + 4);
  local_9b4 = (1 << (cVar1 - 1U & 0x1f)) - (1 << (cVar1 + 7U & 0x1f));
  auVar64 = vpinsrd_avx(ZEXT416(local_9b4),local_9b4,1);
  auVar64 = vpinsrd_avx(auVar64,local_9b4,2);
  auVar64 = vpinsrd_avx(auVar64,local_9b4,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_9b4),local_9b4,1);
  auVar2 = vpinsrd_avx(auVar2,local_9b4,2);
  auStack_70 = vpinsrd_avx(auVar2,local_9b4,3);
  local_80._0_8_ = auVar64._0_8_;
  uVar55 = local_80._0_8_;
  local_80._8_8_ = auVar64._8_8_;
  uVar56 = local_80._8_8_;
  uVar57 = auStack_70._0_8_;
  uVar58 = auStack_70._8_8_;
  local_a14 = *(uint *)(CONCAT44(in_stack_0000002c,h) + 4);
  local_a30._4_4_ = 0;
  local_a30._0_4_ = local_a14;
  uVar41 = local_a30._0_8_;
  local_a30 = ZEXT416(local_a14);
  local_9d0 = auVar65;
  local_80 = auVar64;
  local_50 = local_9b4;
  local_4c = local_9b4;
  local_48 = local_9b4;
  local_44 = local_9b4;
  local_40 = local_9b4;
  local_3c = local_9b4;
  local_38 = local_9b4;
  local_34 = local_9b4;
  for (local_14f0 = 0; local_14f0 < y_step_q4; local_14f0 = local_14f0 + 8) {
    local_1bd0 = in_stack_ffffffffffffe400;
    s_00 = in_stack_ffffffffffffe410;
    for (local_14ec = 0; local_14ec < iVar59; local_14ec = local_14ec + 2) {
      local_bf0 = (undefined1 (*) [16])(lVar60 + local_14ec * local_c40 + (long)local_14f0);
      local_9a0 = *(undefined8 *)*local_bf0;
      uStack_998 = *(undefined8 *)(*local_bf0 + 8);
      local_1820 = ZEXT1632(*local_bf0);
      if (local_14ec + 1 < iVar59) {
        local_bf8 = (undefined1 (*) [16])
                    (lVar60 + local_14ec * local_c40 + (long)local_14f0 + local_c40);
        local_1820._0_16_ = ZEXT116(0) * *local_bf8 + ZEXT116(1) * *local_bf0;
        local_1820._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * *local_bf8;
      }
      data_00[1] = local_1bd0;
      data_00[0] = in_stack_ffffffffffffe3f8;
      data_00[2] = (longlong)in_stack_ffffffffffffe408;
      data_00[3] = (longlong)s_00;
      uVar63 = local_1820._0_8_;
      uVar68 = local_1820._8_8_;
      uVar69 = local_1820._16_8_;
      uVar70 = local_1820._24_8_;
      convolve_lowbd_x(data_00,in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8);
      local_1840._8_8_ = uVar68;
      local_1840._0_8_ = uVar63;
      local_8e0 = uVar43;
      uStack_8d8 = uVar44;
      uStack_8d0 = uVar45;
      uStack_8c8 = uVar46;
      auVar19._16_8_ = uVar69;
      auVar19._0_16_ = local_1840;
      auVar19._24_8_ = uVar70;
      auVar18._16_8_ = uVar45;
      auVar18._0_16_ = auVar3;
      auVar18._24_8_ = uVar46;
      local_980 = vpaddw_avx2(auVar19,auVar18);
      local_990 = uVar42;
      uStack_988 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar42;
      auVar67 = vpsraw_avx2(local_980,auVar2);
      local_ba0 = local_1820._0_8_;
      uStack_b98 = local_1820._8_8_;
      uStack_b90 = local_1820._16_8_;
      uStack_b88 = local_1820._24_8_;
      local_bc0[0] = '\x03';
      local_bc0[1] = 0xff;
      local_bc0[2] = '\x04';
      local_bc0[3] = 0xff;
      local_bc0[4] = '\x05';
      local_bc0[5] = 0xff;
      local_bc0[6] = '\x06';
      local_bc0[7] = 0xff;
      local_bc0[8] = '\a';
      local_bc0[9] = 0xff;
      local_bc0[10] = '\b';
      local_bc0[0xb] = 0xff;
      local_bc0[0xc] = '\t';
      local_bc0[0xd] = 0xff;
      local_bc0[0xe] = '\n';
      local_bc0[0xf] = 0xff;
      local_bc0[0x10] = '\x03';
      local_bc0[0x11] = 0xff;
      local_bc0[0x12] = '\x04';
      local_bc0[0x13] = 0xff;
      local_bc0[0x14] = '\x05';
      local_bc0[0x15] = 0xff;
      local_bc0[0x16] = '\x06';
      local_bc0[0x17] = 0xff;
      local_bc0[0x18] = '\a';
      local_bc0[0x19] = 0xff;
      local_bc0[0x1a] = '\b';
      local_bc0[0x1b] = 0xff;
      local_bc0[0x1c] = '\t';
      local_bc0[0x1d] = 0xff;
      local_bc0[0x1e] = '\n';
      local_bc0[0x1f] = 0xff;
      auVar8[8] = '\a';
      auVar8[9] = 0xff;
      auVar8[10] = '\b';
      auVar8[0xb] = 0xff;
      auVar8[0xc] = '\t';
      auVar8[0xd] = 0xff;
      auVar8[0xe] = '\n';
      auVar8[0xf] = 0xff;
      auVar8[0] = '\x03';
      auVar8[1] = 0xff;
      auVar8[2] = '\x04';
      auVar8[3] = 0xff;
      auVar8[4] = '\x05';
      auVar8[5] = 0xff;
      auVar8[6] = '\x06';
      auVar8[7] = 0xff;
      auVar8[0x10] = '\x03';
      auVar8[0x11] = 0xff;
      auVar8[0x12] = '\x04';
      auVar8[0x13] = 0xff;
      auVar8[0x14] = '\x05';
      auVar8[0x15] = 0xff;
      auVar8[0x16] = '\x06';
      auVar8[0x17] = 0xff;
      auVar8[0x18] = '\a';
      auVar8[0x19] = 0xff;
      auVar8[0x1a] = '\b';
      auVar8[0x1b] = 0xff;
      auVar8[0x1c] = '\t';
      auVar8[0x1d] = 0xff;
      auVar8[0x1e] = '\n';
      auVar8[0x1f] = 0xff;
      auVar66 = vpshufb_avx2(local_1820,auVar8);
      local_1860 = auVar66._0_8_;
      uStack_1858 = auVar66._8_8_;
      uStack_1850 = auVar66._16_8_;
      uStack_1848 = auVar66._24_8_;
      local_884 = 7 - *(int *)CONCAT44(in_stack_0000002c,h);
      local_880 = local_1860;
      uStack_878 = uStack_1858;
      uStack_870 = uStack_1850;
      uStack_868 = uStack_1848;
      auVar66 = vpsllw_avx2(auVar66,ZEXT416(local_884));
      local_1840._0_8_ = auVar67._0_8_;
      local_1840._8_8_ = auVar67._8_8_;
      uStack_1830 = auVar67._16_8_;
      uStack_1828 = auVar67._24_8_;
      local_1860 = auVar66._0_8_;
      uStack_1858 = auVar66._8_8_;
      uStack_1850 = auVar66._16_8_;
      uStack_1848 = auVar66._24_8_;
      local_900 = local_1840._0_8_;
      uStack_8f8 = local_1840._8_8_;
      uStack_8f0 = uStack_1830;
      uStack_8e8 = uStack_1828;
      local_920 = local_1860;
      uStack_918 = uStack_1858;
      uStack_910 = uStack_1850;
      uStack_908 = uStack_1848;
      auVar66 = vpaddw_avx2(auVar67,auVar66);
      local_1840._0_8_ = auVar66._0_8_;
      local_1840._8_8_ = auVar66._8_8_;
      uStack_1830 = auVar66._16_8_;
      uStack_1828 = auVar66._24_8_;
      local_940 = local_1840._0_8_;
      uStack_938 = local_1840._8_8_;
      uStack_930 = uStack_1830;
      uStack_928 = uStack_1828;
      local_960 = uVar47;
      uStack_958 = uVar48;
      uStack_950 = uVar49;
      uStack_948 = uVar50;
      auVar17._16_8_ = uVar49;
      auVar17._0_16_ = auVar4;
      auVar17._24_8_ = uVar50;
      auVar66 = vpaddw_avx2(auVar66,auVar17);
      local_1840._0_8_ = auVar66._0_8_;
      local_1840._8_8_ = auVar66._8_8_;
      uStack_1830 = auVar66._16_8_;
      uStack_1828 = auVar66._24_8_;
      local_800 = local_1840._0_8_;
      uStack_7f8 = local_1840._8_8_;
      uStack_7f0 = uStack_1830;
      uStack_7e8 = uStack_1828;
      local_820 = 0;
      uStack_818 = uVar40;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840 = vpmaxsw_avx2(auVar66,ZEXT832((ulong)uVar40) << 0x40);
      local_860 = uVar51;
      uStack_858 = uVar52;
      uStack_850 = uVar53;
      uStack_848 = uVar54;
      auVar20._16_8_ = uVar53;
      auVar20._0_16_ = auVar5;
      auVar20._24_8_ = uVar54;
      auVar66 = vpminsw_avx2(local_840,auVar20);
      lVar61 = (long)(local_14ec * 8) * 2;
      local_7a8 = (undefined8 *)((long)local_14e0 + lVar61);
      local_1880 = auVar66._0_8_;
      uStack_1878 = auVar66._8_8_;
      uStack_1870 = auVar66._16_8_;
      uStack_1868 = auVar66._24_8_;
      local_7e0 = local_1880;
      uStack_7d8 = uStack_1878;
      uStack_7d0 = uStack_1870;
      uStack_7c8 = uStack_1868;
      local_8c0 = uVar63;
      uStack_8b8 = uVar68;
      uStack_8b0 = uVar69;
      uStack_8a8 = uVar70;
      *local_7a8 = local_1880;
      *(undefined8 *)((long)local_14e0 + lVar61 + 8) = uStack_1878;
      *(undefined8 *)((long)local_14e0 + lVar61 + 0x10) = uStack_1870;
      *(undefined8 *)((long)local_14e0 + lVar61 + 0x18) = uStack_1868;
    }
    local_768 = local_14e0;
    auVar29._8_8_ = local_14e0[1];
    auVar29._0_8_ = local_14e0[0];
    auVar29._16_8_ = local_14e0[2];
    auVar29._24_8_ = local_14e0[3];
    auVar28._8_8_ = local_14e0[1];
    auVar28._0_8_ = local_14e0[0];
    auVar28._16_8_ = local_14e0[2];
    auVar28._24_8_ = local_14e0[3];
    local_770 = local_14e0 + 2;
    auVar31._8_8_ = local_14e0[3];
    auVar31._0_8_ = local_14e0[2];
    auVar31._16_8_ = local_14c0;
    auVar31._24_8_ = uStack_14b8;
    auVar30._8_8_ = local_14e0[3];
    auVar30._0_8_ = local_14e0[2];
    auVar30._16_8_ = local_14c0;
    auVar30._24_8_ = uStack_14b8;
    local_778 = &local_14c0;
    auVar33._8_8_ = uStack_14b8;
    auVar33._0_8_ = local_14c0;
    auVar33._16_8_ = uStack_14b0;
    auVar33._24_8_ = uStack_14a8;
    auVar32._8_8_ = uStack_14b8;
    auVar32._0_8_ = local_14c0;
    auVar32._16_8_ = uStack_14b0;
    auVar32._24_8_ = uStack_14a8;
    local_780 = &uStack_14b0;
    auVar35._8_8_ = uStack_14a8;
    auVar35._0_8_ = uStack_14b0;
    auVar35._16_8_ = local_14a0;
    auVar35._24_8_ = uStack_1498;
    auVar34._8_8_ = uStack_14a8;
    auVar34._0_8_ = uStack_14b0;
    auVar34._16_8_ = local_14a0;
    auVar34._24_8_ = uStack_1498;
    local_788 = &local_14a0;
    auVar37._8_8_ = uStack_1498;
    auVar37._0_8_ = local_14a0;
    auVar37._16_8_ = uStack_1490;
    auVar37._24_8_ = uStack_1488;
    auVar36._8_8_ = uStack_1498;
    auVar36._0_8_ = local_14a0;
    auVar36._16_8_ = uStack_1490;
    auVar36._24_8_ = uStack_1488;
    local_790 = &uStack_1490;
    auVar39._8_8_ = uStack_1488;
    auVar39._0_8_ = uStack_1490;
    auVar39._16_8_ = uStack_1480;
    auVar39._24_8_ = uStack_1478;
    auVar38._8_8_ = uStack_1488;
    auVar38._0_8_ = uStack_1490;
    auVar38._16_8_ = uStack_1480;
    auVar38._24_8_ = uStack_1478;
    local_1a40 = vpunpcklwd_avx2(auVar28,auVar30);
    local_1a20 = vpunpcklwd_avx2(auVar32,auVar34);
    local_1a00 = vpunpcklwd_avx2(auVar36,auVar38);
    local_19c0 = vpunpckhwd_avx2(auVar29,auVar31);
    local_19a0 = vpunpckhwd_avx2(auVar33,auVar35);
    local_1980 = vpunpckhwd_avx2(auVar37,auVar39);
    for (local_14ec = 0; local_14ec < w + -1; local_14ec = local_14ec + 2) {
      lVar61 = (long)(local_14ec * 8) * 2;
      local_798 = (undefined1 (*) [32])((long)&uStack_1480 + lVar61);
      local_740 = *(undefined8 *)*local_798;
      uStack_738 = *(undefined8 *)((long)auStack_1470 + lVar61 + -8);
      uStack_730 = *(undefined8 *)((long)auStack_1470 + lVar61);
      uStack_728 = *(undefined8 *)((long)auStack_1470 + lVar61 + 8);
      local_7a0 = (undefined1 (*) [32])((long)auStack_1470 + lVar61);
      local_760 = *(undefined8 *)*local_7a0;
      uStack_758 = *(undefined8 *)((long)auStack_1470 + lVar61 + 8);
      uStack_750 = *(undefined8 *)((long)auStack_1470 + lVar61 + 0x10);
      uStack_748 = *(undefined8 *)((long)auStack_1470 + lVar61 + 0x18);
      auVar7 = vpunpcklwd_avx2(*local_798,*local_7a0);
      auVar6 = vpunpckhwd_avx2(*local_798,*local_7a0);
      auVar66 = auVar6;
      local_660 = local_760;
      uStack_658 = uStack_758;
      uStack_650 = uStack_750;
      uStack_648 = uStack_748;
      local_640 = local_740;
      uStack_638 = uStack_738;
      uStack_630 = uStack_730;
      uStack_628 = uStack_728;
      convolve(s_00,in_stack_ffffffffffffe408);
      auVar67 = auVar66;
      convolve(s_00,in_stack_ffffffffffffe408);
      local_1ac0 = auVar66._0_8_;
      local_400 = local_1ac0;
      uStack_1ab8 = auVar66._8_8_;
      uStack_3f8 = uStack_1ab8;
      uStack_1ab0 = auVar66._16_8_;
      uStack_3f0 = uStack_1ab0;
      uStack_1aa8 = auVar66._24_8_;
      uStack_3e8 = uStack_1aa8;
      local_420 = uVar55;
      uStack_418 = uVar56;
      uStack_410 = uVar57;
      uStack_408 = uVar58;
      auVar26._16_8_ = uVar57;
      auVar26._0_16_ = auVar64;
      auVar26._24_8_ = uVar58;
      local_4c0 = vpaddd_avx2(auVar66,auVar26);
      local_4d0 = uVar41;
      uStack_4c8 = 0;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar41;
      auVar66 = vpsrad_avx2(local_4c0,auVar22);
      local_1ae0 = auVar67._0_8_;
      local_440 = local_1ae0;
      uStack_1ad8 = auVar67._8_8_;
      uStack_438 = uStack_1ad8;
      uStack_1ad0 = auVar67._16_8_;
      uStack_430 = uStack_1ad0;
      uStack_1ac8 = auVar67._24_8_;
      uStack_428 = uStack_1ac8;
      local_460 = uVar55;
      uStack_458 = uVar56;
      uStack_450 = uVar57;
      uStack_448 = uVar58;
      auVar25._16_8_ = uVar57;
      auVar25._0_16_ = auVar64;
      auVar25._24_8_ = uVar58;
      local_500 = vpaddd_avx2(auVar67,auVar25);
      local_510 = uVar41;
      uStack_508 = 0;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar41;
      auVar67 = vpsrad_avx2(local_500,auVar65);
      local_1b00 = auVar66._0_8_;
      local_3c0 = local_1b00;
      uStack_1af8 = auVar66._8_8_;
      uStack_3b8 = uStack_1af8;
      uStack_1af0 = auVar66._16_8_;
      uStack_3b0 = uStack_1af0;
      uStack_1ae8 = auVar66._24_8_;
      uStack_3a8 = uStack_1ae8;
      local_1b20 = auVar67._0_8_;
      local_3e0 = local_1b20;
      uStack_1b18 = auVar67._8_8_;
      uStack_3d8 = uStack_1b18;
      uStack_1b10 = auVar67._16_8_;
      uStack_3d0 = uStack_1b10;
      uStack_1b08 = auVar67._24_8_;
      uStack_3c8 = uStack_1b08;
      auVar66 = vpackssdw_avx2(auVar66,auVar67);
      local_1b40 = auVar66._0_8_;
      local_3a0 = local_1b40;
      uStack_1b38 = auVar66._8_8_;
      uStack_398 = uStack_1b38;
      uStack_1b30 = auVar66._16_8_;
      uStack_390 = uStack_1b30;
      uStack_1b28 = auVar66._24_8_;
      uStack_388 = uStack_1b28;
      auVar66 = vpackuswb_avx2(auVar66,auVar66);
      local_1b60 = auVar66._0_8_;
      local_340 = local_1b60;
      uStack_1b58 = auVar66._8_8_;
      uStack_338 = uStack_1b58;
      uStack_1b50 = auVar66._16_8_;
      uStack_330 = uStack_1b50;
      uStack_1b48 = auVar66._24_8_;
      uStack_328 = uStack_1b48;
      uStack_2d8 = uStack_1b48;
      local_2e0 = uStack_1b50;
      local_2c8 = (undefined8 *)(local_c48 + local_14ec * local_c50 + (long)local_14f0);
      local_2e8 = (undefined8 *)(local_c48 + local_14ec * local_c50 + (long)local_14f0 + local_c50);
      *local_2c8 = uStack_1b50;
      *local_2e8 = local_1b80;
      local_1a40 = local_1a20;
      local_1a20 = local_1a00;
      local_19c0 = local_19a0;
      local_19a0 = local_1980;
      local_1a00 = auVar7;
      local_1980 = auVar6;
      local_380 = local_3a0;
      uStack_378 = uStack_398;
      uStack_370 = uStack_390;
      uStack_368 = uStack_388;
    }
    palStack_1bc8 = in_stack_ffffffffffffe408;
    in_stack_ffffffffffffe410 = s_00;
    if (w != local_14ec) {
      vperm2i128_avx2(local_1a40,local_19c0,0x20);
      vperm2i128_avx2(local_1a20,local_19a0,0x20);
      vperm2i128_avx2(local_1a00,local_1980,0x20);
      lVar61 = (long)(local_14ec * 8) * 2;
      local_c00 = (undefined1 (*) [16])((long)&uStack_1480 + lVar61);
      local_2b0 = *(undefined8 *)*local_c00;
      uStack_2a8 = *(undefined8 *)((long)auStack_1470 + lVar61 + -8);
      local_c08 = (undefined1 (*) [16])((long)auStack_1470 + lVar61);
      local_2c0 = *(undefined8 *)*local_c08;
      uStack_2b8 = *(undefined8 *)((long)auStack_1470 + lVar61 + 8);
      auVar2 = vpunpcklwd_avx(*local_c00,*local_c08);
      vpunpckhwd_avx(*local_c00,*local_c08);
      local_1bd0 = auVar2._0_8_;
      palStack_1bc8 = auVar2._8_8_;
      local_9b0 = local_1bd0;
      palStack_9a8 = palStack_1bc8;
      in_stack_ffffffffffffe410 = (__m256i *)0x0;
      uVar63 = 0;
      local_2a0 = local_2c0;
      uStack_298 = uStack_2b8;
      local_290 = local_2b0;
      uStack_288 = uStack_2a8;
      convolve(s_00,in_stack_ffffffffffffe408);
      local_4a0 = uVar55;
      uStack_498 = uVar56;
      uStack_490 = uVar57;
      uStack_488 = uVar58;
      auVar24._8_8_ = palStack_1bc8;
      auVar24._0_8_ = local_1bd0;
      auVar24._16_8_ = in_stack_ffffffffffffe410;
      auVar24._24_8_ = uVar63;
      auVar23._16_8_ = uVar57;
      auVar23._0_16_ = auVar64;
      auVar23._24_8_ = uVar58;
      local_540 = vpaddd_avx2(auVar24,auVar23);
      local_550 = uVar41;
      uStack_548 = 0;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar41;
      auVar66 = vpsrad_avx2(local_540,auVar21);
      local_1c20 = auVar66._0_8_;
      in_stack_ffffffffffffe3e8 = auVar66._8_8_;
      in_stack_ffffffffffffe3f0 = auVar66._16_8_;
      in_stack_ffffffffffffe3f8 = auVar66._24_8_;
      local_360 = local_1c20;
      auVar27._8_8_ = uStackY_1c38;
      auVar27._0_8_ = local_1c40;
      auVar2 = vpackusdw_avx(auVar66._16_16_,auVar27);
      local_1c50 = auVar2._0_8_;
      uStackY_1c48 = auVar2._8_8_;
      local_250 = local_1c50;
      uStack_248 = uStackY_1c48;
      local_260 = local_1c50;
      uStack_258 = uStackY_1c48;
      auVar2 = vpackuswb_avx(auVar2,auVar2);
      local_308 = (undefined8 *)(local_c48 + local_14ec * local_c50 + (long)local_14f0);
      local_1c60 = auVar2._0_8_;
      uStackY_1c58 = auVar2._8_8_;
      local_320 = local_1c60;
      uStack_318 = uStackY_1c58;
      *local_308 = local_1c60;
      local_480 = local_1bd0;
      palStack_478 = palStack_1bc8;
      palStack_470 = in_stack_ffffffffffffe410;
      uStack_468 = uVar63;
      palStack_358 = in_stack_ffffffffffffe3e8;
      palStack_350 = in_stack_ffffffffffffe3f0;
      uStack_348 = in_stack_ffffffffffffe3f8;
      local_270 = in_stack_ffffffffffffe3f0;
      uStack_268 = in_stack_ffffffffffffe3f8;
    }
    in_stack_ffffffffffffe400 = local_1bd0;
    in_stack_ffffffffffffe408 = palStack_1bc8;
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_avx2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + SUBPEL_TAPS) * 8]);
  int im_h = h + SUBPEL_TAPS - 2;
  int im_stride = 8;
  memset(im_block + (im_h * im_stride), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = (SUBPEL_TAPS - 1) / 2;
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  __m256i filt[4], coeffs_h[4], coeffs_v[4], filt_center;

  assert(conv_params->round_0 > 0);

  filt[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);
  filt[2] = _mm256_load_si256((__m256i const *)filt3_global_avx2);
  filt[3] = _mm256_load_si256((__m256i const *)filt4_global_avx2);

  filt_center = _mm256_load_si256((__m256i const *)filt_center_global_avx2);

  const __m128i coeffs_x = _mm_loadu_si128((__m128i *)filter_x);
  const __m256i filter_coeffs_x = _mm256_broadcastsi128_si256(coeffs_x);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_h[0] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_h[1] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_h[2] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_h[3] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0e0cu));

  const __m256i round_const_h =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)));
  const __m256i round_const_horz =
      _mm256_set1_epi16((1 << (bd + FILTER_BITS - conv_params->round_0 - 1)));
  const __m256i clamp_low = _mm256_setzero_si256();
  const __m256i clamp_high =
      _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0);

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i zero_128 = _mm_setzero_si128();
  const __m128i offset_0 = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);
  const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset_0);

  const __m256i filter_coeffs_y = _mm256_broadcastsi128_si256(coeffs_y);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_v[0] = _mm256_shuffle_epi32(filter_coeffs_y, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_v[1] = _mm256_shuffle_epi32(filter_coeffs_y, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_v[2] = _mm256_shuffle_epi32(filter_coeffs_y, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_v[3] = _mm256_shuffle_epi32(filter_coeffs_y, 0xff);

  const __m256i round_const_v =
      _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                        (1 << (bd + conv_params->round_1 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  for (j = 0; j < w; j += 8) {
    for (i = 0; i < im_h; i += 2) {
      __m256i data = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + j]));

      // Load the next line
      if (i + 1 < im_h)
        data = _mm256_inserti128_si256(
            data,
            _mm_loadu_si128(
                (__m128i *)&src_ptr[(i * src_stride) + j + src_stride]),
            1);

      __m256i res = convolve_lowbd_x(data, coeffs_h, filt);

      res =
          _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h), round_shift_h);

      __m256i data_0 = _mm256_shuffle_epi8(data, filt_center);

      // multiply the center pixel by 2^(FILTER_BITS - round_0) and add it to
      // the result
      data_0 = _mm256_slli_epi16(data_0, FILTER_BITS - conv_params->round_0);
      res = _mm256_add_epi16(res, data_0);
      res = _mm256_add_epi16(res, round_const_horz);
      const __m256i res_clamped =
          _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high);
      _mm256_store_si256((__m256i *)&im_block[i * im_stride], res_clamped);
    }

    /* Vertical filter */
    {
      __m256i src_0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i src_1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i src_2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i src_3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i src_4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i src_5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      __m256i s[8];
      s[0] = _mm256_unpacklo_epi16(src_0, src_1);
      s[1] = _mm256_unpacklo_epi16(src_2, src_3);
      s[2] = _mm256_unpacklo_epi16(src_4, src_5);

      s[4] = _mm256_unpackhi_epi16(src_0, src_1);
      s[5] = _mm256_unpackhi_epi16(src_2, src_3);
      s[6] = _mm256_unpackhi_epi16(src_4, src_5);

      for (i = 0; i < h - 1; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        __m256i res_a = convolve(s, coeffs_v);
        __m256i res_b = convolve(s + 4, coeffs_v);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);
        const __m256i res_b_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_b, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        const __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
        // 8 bit conversion and saturation to uint8
        const __m256i res_8b = _mm256_packus_epi16(res_16bit, res_16bit);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);

        // Store values into the destination buffer
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + j + dst_stride];

        _mm_storel_epi64(p_0, res_0);
        _mm_storel_epi64(p_1, res_1);

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
      if (h - i) {
        s[0] = _mm256_permute2x128_si256(s[0], s[4], 0x20);
        s[1] = _mm256_permute2x128_si256(s[1], s[5], 0x20);
        s[2] = _mm256_permute2x128_si256(s[2], s[6], 0x20);

        const int16_t *data = &im_block[i * im_stride];
        const __m128i s6_ = _mm_loadu_si128((__m128i *)(data + 6 * im_stride));
        const __m128i s7_ = _mm_loadu_si128((__m128i *)(data + 7 * im_stride));

        __m128i s3 = _mm_unpacklo_epi16(s6_, s7_);
        __m128i s7 = _mm_unpackhi_epi16(s6_, s7_);

        s[3] = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s7, 1);
        __m256i convolveres = convolve(s, coeffs_v);

        const __m256i res_round = _mm256_sra_epi32(
            _mm256_add_epi32(convolveres, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        __m128i reslo = _mm256_castsi256_si128(res_round);
        __m128i reshi = _mm256_extracti128_si256(res_round, 1);
        const __m128i res_16bit = _mm_packus_epi32(reslo, reshi);

        // 8 bit conversion and saturation to uint8
        const __m128i res_8b = _mm_packus_epi16(res_16bit, res_16bit);
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p_0, res_8b);
      }
    }
  }
}